

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * ORPG::Utils::file_to_string(string *__return_storage_ptr__,string *file)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string local_310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  istream local_220 [8];
  ifstream screen_file;
  string *file_local;
  string *ret;
  
  Core::DATA_LOCATION_abi_cxx11_();
  std::operator+(&local_260,&local_280,"/");
  std::operator+(&local_240,&local_260,file);
  std::ifstream::ifstream(local_220,&local_240,8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  buffer.field_2._M_local_buf[0xb] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",
             (allocator<char> *)(buffer.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator((allocator<char> *)(buffer.field_2._M_local_buf + 10));
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    Core::DATA_LOCATION_abi_cxx11_();
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    printf("file %s/%s could not be opened\n",uVar4,uVar5);
    std::__cxx11::string::~string(local_310);
  }
  else {
    std::__cxx11::string::string((string *)local_2b0);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_220,(string *)local_2b0);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::operator+(&local_2f0,__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0)
      ;
      std::operator+(&local_2d0,&local_2f0,'\n');
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)local_2b0);
  }
  buffer.field_2._M_local_buf[0xb] = '\x01';
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

string file_to_string(string file) {
            // Open the data file for the current screen
            ifstream screen_file(Core::DATA_LOCATION()+"/"+file);
            string ret = "";

            if (screen_file.is_open()) {
                string buffer;

                while (getline(screen_file, buffer)) {
                    ret = ret + buffer + '\n';
                }
                screen_file.close();
            }
            else {
                // TODO: Raise an exception here, if an asset file
                // cannot be opened then something serious has gone wrong.
                printf("file %s/%s could not be opened\n", Core::DATA_LOCATION().c_str(), file.c_str());
            }

            return ret;
        }